

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O0

IEnumerableCore<linq::IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>_>
* __thiscall
linq::IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>>::
Intersect<linq::IEnumerable<int>&>
          (IEnumerableCore<linq::IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>_>
           *__return_storage_ptr__,
          IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>> *this,
          IEnumerable<int> *other)

{
  IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>
  local_b0;
  anon_class_1_0_00000001_for_transformer local_21;
  IEnumerable<int> *pIStack_20;
  anon_class_1_0_00000001_for_transformer f;
  IEnumerable<int> *other_local;
  IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_> *this_local;
  
  pIStack_20 = other;
  IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>
  ::IntersectState(&local_b0,(AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_> *)this,
                   other,&local_21);
  IEnumerableCore<linq::IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>_>
  ::IEnumerableCore(__return_storage_ptr__,&local_b0);
  IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>
  ::~IntersectState(&local_b0);
  return __return_storage_ptr__;
}

Assistant:

auto Intersect(O&& other)
		{
			using S2 = typename std::remove_reference<O>::type;
			using TS = typename std::remove_reference<T>::type;
			auto f = [](TS x) { return x; };
			using F = decltype(f);
			return IEnumerableCore<IntersectState<S, S2, F, TS>>(IntersectState<S, S2, F, TS>(std::move(source), std::move(other), f));
		}